

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

Transform *
pbrt::Rotate(Transform *__return_storage_ptr__,Float sinTheta,Float cosTheta,Vector3f *axis)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  int i_1;
  undefined1 (*pauVar6) [16];
  int i;
  long lVar7;
  undefined8 *puVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  SquareMatrix<4> m;
  SquareMatrix<4> r;
  undefined1 local_90 [48];
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined1 local_50 [16];
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  
  fVar11 = (axis->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar13 = ZEXT416((uint)(axis->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar13,auVar13);
  auVar18 = ZEXT416((uint)(axis->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar13 = vfmadd213ss_fma(auVar18,auVar18,auVar13);
  if (auVar13._0_4_ < 0.0) {
    fVar11 = sqrtf(auVar13._0_4_);
  }
  else {
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    fVar11 = auVar13._0_4_;
  }
  fVar12 = (axis->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar1 = (axis->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar2 = (axis->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar13._4_4_ = uVar2;
  auVar13._0_4_ = uVar1;
  auVar13._8_8_ = 0;
  pauVar6 = (undefined1 (*) [16])local_90;
  lVar7 = 0;
  auVar10 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  do {
    auVar9 = vpbroadcastq_avx512vl();
    uVar3 = vpcmpeqq_avx512vl(auVar9,auVar10);
    auVar18 = vpmovm2d_avx512vl(uVar3 & 0xf);
    auVar18 = vpsrld_avx(auVar18,0x1f);
    auVar18 = vcvtdq2ps_avx(auVar18);
    *pauVar6 = auVar18;
    lVar7 = lVar7 + 1;
    pauVar6 = pauVar6 + 1;
  } while (lVar7 != 4);
  auVar17._0_4_ = fVar12 / fVar11;
  auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar14._4_4_ = fVar11;
  auVar14._0_4_ = fVar11;
  auVar14._8_4_ = fVar11;
  auVar14._12_4_ = fVar11;
  auVar13 = vdivps_avx(auVar13,auVar14);
  auVar16 = SUB6416(ZEXT464(0x3f800000),0);
  auVar18 = vfnmadd213ss_fma(auVar17,auVar17,auVar16);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * cosTheta)),auVar17,auVar17);
  fVar11 = 1.0 - cosTheta;
  auVar14 = vmovshdup_avx(auVar13);
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  auVar20 = ZEXT416((uint)(sinTheta * auVar14._0_4_));
  auVar18 = vxorps_avx512vl(auVar20,auVar18);
  fVar12 = auVar13._0_4_;
  auVar21._0_4_ = auVar17._0_4_ * fVar12;
  auVar21._4_4_ = auVar17._0_4_ * auVar13._4_4_;
  auVar21._8_4_ = auVar17._0_4_ * auVar13._8_4_;
  auVar21._12_4_ = auVar17._0_4_ * auVar13._12_4_;
  auVar22._4_4_ = fVar11;
  auVar22._0_4_ = fVar11;
  auVar22._8_4_ = fVar11;
  auVar22._12_4_ = fVar11;
  auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)(sinTheta * fVar12)),0x1c);
  auVar18 = vfmadd231ps_fma(auVar18,auVar21,auVar22);
  uVar3 = vmovlps_avx(auVar18);
  local_90._4_4_ = (undefined4)uVar3;
  lVar7 = 0;
  auVar19 = ZEXT416((uint)fVar11);
  auVar18 = vfmadd231ss_fma(auVar20,auVar21,auVar19);
  auVar20 = vfnmadd213ss_fma(auVar13,auVar13,auVar16);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * cosTheta)),auVar13,auVar13);
  auVar15 = ZEXT416((uint)(fVar12 * auVar14._0_4_));
  auVar22 = vfmsub213ss_fma(auVar19,auVar15,ZEXT416((uint)(sinTheta * auVar17._0_4_)));
  auVar13 = vmovshdup_avx(auVar21);
  auVar21 = vfmsub213ss_fma(auVar13,auVar19,ZEXT416((uint)(sinTheta * fVar12)));
  auVar13 = vfmadd213ss_fma(auVar19,auVar15,ZEXT416((uint)(sinTheta * auVar17._0_4_)));
  auVar15 = vfnmadd231ss_fma(auVar16,auVar14,auVar14);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * cosTheta)),auVar14,auVar14);
  pauVar6 = &local_50;
  do {
    auVar9 = vpbroadcastq_avx512vl();
    uVar4 = vpcmpeqq_avx512vl(auVar9,auVar10);
    auVar15 = vpmovm2d_avx512vl(uVar4 & 0xf);
    auVar15 = vpsrld_avx(auVar15,0x1f);
    auVar15 = vcvtdq2ps_avx(auVar15);
    *pauVar6 = auVar15;
    lVar7 = lVar7 + 1;
    pauVar6 = pauVar6 + 1;
  } while (lVar7 != 4);
  auVar10 = vpbroadcastq_avx512vl();
  auVar10 = vpaddq_avx2(auVar10,_DAT_005cc280);
  pauVar6 = &local_50;
  puVar8 = (undefined8 *)0x0;
  do {
    auVar9 = vpbroadcastq_avx512vl();
    auVar9 = vpsllq_avx2(auVar9,2);
    vpaddq_avx2(auVar10,auVar9);
    auVar15 = vgatherqps_avx512vl(*puVar8);
    *pauVar6 = auVar15;
    puVar8 = (undefined8 *)((long)puVar8 + 1);
    pauVar6 = pauVar6 + 1;
  } while (puVar8 != (undefined8 *)&DAT_00000004);
  *(ulong *)(__return_storage_ptr__->m).m[0] = CONCAT44(local_90._4_4_,auVar5._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[0] + 2) = uVar3 >> 0x20;
  *(ulong *)(__return_storage_ptr__->m).m[1] = CONCAT44(auVar20._0_4_,auVar18._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[1] + 2) = (ulong)auVar22._0_4_;
  *(ulong *)(__return_storage_ptr__->m).m[2] = CONCAT44(auVar13._0_4_,auVar21._0_4_);
  *(ulong *)((__return_storage_ptr__->m).m[2] + 2) = (ulong)auVar14._0_4_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = uStack_60;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = uStack_58;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[0] = local_50._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[0] + 2) = local_50._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[1] = uStack_40;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[1] + 2) = uStack_38;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[2] = uStack_30;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[2] + 2) = uStack_28;
  *(undefined8 *)(__return_storage_ptr__->mInv).m[3] = uStack_20;
  *(undefined8 *)((__return_storage_ptr__->mInv).m[3] + 2) = uStack_18;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
inline Transform Rotate(Float sinTheta, Float cosTheta, const Vector3f &axis) {
    Vector3f a = Normalize(axis);
    SquareMatrix<4> m;
    // Compute rotation of first basis vector
    m[0][0] = a.x * a.x + (1 - a.x * a.x) * cosTheta;
    m[0][1] = a.x * a.y * (1 - cosTheta) - a.z * sinTheta;
    m[0][2] = a.x * a.z * (1 - cosTheta) + a.y * sinTheta;
    m[0][3] = 0;

    // Compute rotations of second and third basis vectors
    m[1][0] = a.x * a.y * (1 - cosTheta) + a.z * sinTheta;
    m[1][1] = a.y * a.y + (1 - a.y * a.y) * cosTheta;
    m[1][2] = a.y * a.z * (1 - cosTheta) - a.x * sinTheta;
    m[1][3] = 0;

    m[2][0] = a.x * a.z * (1 - cosTheta) - a.y * sinTheta;
    m[2][1] = a.y * a.z * (1 - cosTheta) + a.x * sinTheta;
    m[2][2] = a.z * a.z + (1 - a.z * a.z) * cosTheta;
    m[2][3] = 0;

    return Transform(m, Transpose(m));
}